

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O0

void helper_crypto_sha256h_arm(void *vd,void *vn,void *vm)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  int local_6c;
  uint32_t t;
  int i;
  CRYPTO_STATE m;
  CRYPTO_STATE n;
  CRYPTO_STATE d;
  uint64_t *rm;
  uint64_t *rn;
  uint64_t *rd;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  n.l[1] = *vd;
  d.l[0] = *(uint64_t *)((long)vd + 8);
  m.l[1] = *vn;
  n.l[0] = *(uint64_t *)((long)vn + 8);
  _t = *vm;
  m.l[0] = *(uint64_t *)((long)vm + 8);
  d.l[1] = (uint64_t)vm;
  rm = (uint64_t *)vn;
  rn = (uint64_t *)vd;
  rd = (uint64_t *)vm;
  vm_local = vn;
  vn_local = vd;
  for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
    uVar1 = cho(m.words[2],m.words[3],n.words[0]);
    iVar2 = uVar1 + n.words[1];
    uVar1 = S1(m.words[2]);
    iVar2 = iVar2 + uVar1 + (&t)[local_6c];
    n.l[0] = CONCAT44((int)n.l[0],m.words[3]);
    m.l[1] = CONCAT44((int)m.l[1],d.words[1] + iVar2);
    uVar1 = maj(n.words[2],n.words[3],d.words[0]);
    uVar3 = S0(n.words[2]);
    d.l[0] = CONCAT44((int)d.l[0],n.words[3]);
    n.l[1] = CONCAT44((int)n.l[1],uVar1 + uVar3 + iVar2);
  }
  *rn = n.l[1];
  rn[1] = d.l[0];
  return;
}

Assistant:

void HELPER(crypto_sha256h)(void *vd, void *vn, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };
    int i;

    for (i = 0; i < 4; i++) {
        uint32_t t = cho(CR_ST_WORD(n, 0), CR_ST_WORD(n, 1), CR_ST_WORD(n, 2))
                     + CR_ST_WORD(n, 3) + S1(CR_ST_WORD(n, 0))
                     + CR_ST_WORD(m, i);

        CR_ST_WORD(n, 3) = CR_ST_WORD(n, 2);
        CR_ST_WORD(n, 2) = CR_ST_WORD(n, 1);
        CR_ST_WORD(n, 1) = CR_ST_WORD(n, 0);
        CR_ST_WORD(n, 0) = CR_ST_WORD(d, 3) + t;

        t += maj(CR_ST_WORD(d, 0), CR_ST_WORD(d, 1), CR_ST_WORD(d, 2))
             + S0(CR_ST_WORD(d, 0));

        CR_ST_WORD(d, 3) = CR_ST_WORD(d, 2);
        CR_ST_WORD(d, 2) = CR_ST_WORD(d, 1);
        CR_ST_WORD(d, 1) = CR_ST_WORD(d, 0);
        CR_ST_WORD(d, 0) = t;
    }

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}